

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O2

void __thiscall Fl_Group::resize(Fl_Group *this,int X,int Y,int W,int H)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Fl_Widget *pFVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Fl_Widget ***pppFVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  
  iVar1 = (this->super_Fl_Widget).x_;
  iVar2 = (this->super_Fl_Widget).y_;
  iVar12 = (this->super_Fl_Widget).w_;
  iVar8 = (this->super_Fl_Widget).h_;
  piVar11 = sizes(this);
  Fl_Widget::resize(&this->super_Fl_Widget,X,Y,W,H);
  if ((this->resizable_ == (Fl_Widget *)0x0) || ((iVar12 == W && (iVar8 == H)))) {
    if ((this->super_Fl_Widget).type_ < 0xf0) {
      iVar12 = this->children_;
      if (iVar12 < 2) {
        pppFVar15 = &this->array_;
      }
      else {
        pppFVar15 = (Fl_Widget ***)this->array_;
      }
      for (lVar19 = 0; iVar12 != (int)lVar19; lVar19 = lVar19 + 1) {
        pFVar7 = (Fl_Widget *)pppFVar15[lVar19];
        (*pFVar7->_vptr_Fl_Widget[4])
                  (pFVar7,(ulong)(uint)(pFVar7->x_ + (X - iVar1)),
                   (ulong)(uint)(pFVar7->y_ + (Y - iVar2)),(ulong)(uint)pFVar7->w_,
                   (ulong)(uint)pFVar7->h_);
      }
    }
  }
  else {
    iVar1 = this->children_;
    if (iVar1 != 0) {
      iVar8 = (*piVar11 - piVar11[1]) + W;
      iVar14 = (piVar11[2] - piVar11[3]) + H;
      lVar19 = 0;
      iVar12 = X - *piVar11;
      iVar2 = Y - piVar11[2];
      if (0xef < (this->super_Fl_Widget).type_) {
        iVar12 = 0;
        iVar2 = 0;
      }
      iVar3 = piVar11[4];
      iVar4 = piVar11[5];
      iVar5 = piVar11[6];
      iVar6 = piVar11[7];
      if (iVar1 < 2) {
        pppFVar15 = &this->array_;
      }
      else {
        pppFVar15 = (Fl_Widget ***)this->array_;
      }
      piVar11 = piVar11 + 8;
      iVar9 = iVar4 - iVar3;
      iVar10 = iVar6 - iVar5;
      for (; iVar1 != (int)lVar19; lVar19 = lVar19 + 1) {
        iVar16 = *piVar11;
        if (iVar16 < iVar4) {
          if (iVar16 - iVar3 != 0 && iVar3 <= iVar16) {
            iVar16 = ((iVar16 - iVar3) * ((iVar8 - iVar3) + iVar4) + iVar9 / 2) / iVar9 + iVar3;
          }
        }
        else {
          iVar16 = iVar16 + iVar8;
        }
        iVar13 = piVar11[1];
        if (iVar13 < iVar4) {
          if (iVar13 - iVar3 != 0 && iVar3 <= iVar13) {
            iVar13 = ((iVar13 - iVar3) * ((iVar8 + iVar4) - iVar3) + iVar9 / 2) / iVar9 + iVar3;
          }
        }
        else {
          iVar13 = iVar13 + iVar8;
        }
        iVar18 = piVar11[2];
        if (iVar18 < iVar6) {
          if (iVar18 - iVar5 != 0 && iVar5 <= iVar18) {
            iVar18 = ((iVar18 - iVar5) * ((iVar14 - iVar5) + iVar6) + iVar10 / 2) / iVar10 + iVar5;
          }
        }
        else {
          iVar18 = iVar18 + iVar14;
        }
        iVar17 = piVar11[3];
        if (iVar17 < iVar6) {
          if (iVar17 - iVar5 != 0 && iVar5 <= iVar17) {
            iVar17 = ((iVar17 - iVar5) * ((iVar14 + iVar6) - iVar5) + iVar10 / 2) / iVar10 + iVar5;
          }
        }
        else {
          iVar17 = iVar17 + iVar14;
        }
        (*((Fl_Widget *)pppFVar15[lVar19])->_vptr_Fl_Widget[4])
                  ((Fl_Widget *)pppFVar15[lVar19],(ulong)(uint)(iVar16 + iVar12),
                   (ulong)(uint)(iVar18 + iVar2),(ulong)(uint)(iVar13 - iVar16),
                   (ulong)(uint)(iVar17 - iVar18));
        piVar11 = piVar11 + 4;
      }
    }
  }
  return;
}

Assistant:

void Fl_Group::resize(int X, int Y, int W, int H) {

  int dx = X-x();
  int dy = Y-y();
  int dw = W-w();
  int dh = H-h();
  
  int *p = sizes(); // save initial sizes and positions

  Fl_Widget::resize(X,Y,W,H); // make new xywh values visible for children

  if (!resizable() || (dw==0 && dh==0) ) {

    if (type() < FL_WINDOW) {
      Fl_Widget*const* a = array();
      for (int i=children_; i--;) {
	Fl_Widget* o = *a++;
	o->resize(o->x()+dx, o->y()+dy, o->w(), o->h());
      }
    }

  } else if (children_) {

    // get changes in size/position from the initial size:
    dx = X - p[0];
    dw = W - (p[1]-p[0]);
    dy = Y - p[2];
    dh = H - (p[3]-p[2]);
    if (type() >= FL_WINDOW) dx = dy = 0;
    p += 4;

    // get initial size of resizable():
    int IX = *p++;
    int IR = *p++;
    int IY = *p++;
    int IB = *p++;

    Fl_Widget*const* a = array();
    for (int i=children_; i--;) {
      Fl_Widget* o = *a++;
#if 1
      int XX = *p++;
      if (XX >= IR) XX += dw;
      else if (XX > IX) XX = IX+((XX-IX)*(IR+dw-IX)+(IR-IX)/2)/(IR-IX);
      int R = *p++;
      if (R >= IR) R += dw;
      else if (R > IX) R = IX+((R-IX)*(IR+dw-IX)+(IR-IX)/2)/(IR-IX);

      int YY = *p++;
      if (YY >= IB) YY += dh;
      else if (YY > IY) YY = IY+((YY-IY)*(IB+dh-IY)+(IB-IY)/2)/(IB-IY);
      int B = *p++;
      if (B >= IB) B += dh;
      else if (B > IY) B = IY+((B-IY)*(IB+dh-IY)+(IB-IY)/2)/(IB-IY);
#else // much simpler code from Francois Ostiguy:
      int XX = *p++;
      if (XX >= IR) XX += dw;
      else if (XX > IX) XX += dw * (XX-IX)/(IR-IX);
      int R = *p++;
      if (R >= IR) R += dw;
      else if (R > IX) R = R + dw * (R-IX)/(IR-IX);

      int YY = *p++;
      if (YY >= IB) YY += dh;
      else if (YY > IY) YY = YY + dh*(YY-IY)/(IB-IY);
      int B = *p++;
      if (B >= IB) B += dh;
      else if (B > IY) B = B + dh*(B-IY)/(IB-IY);
#endif
      o->resize(XX+dx, YY+dy, R-XX, B-YY);
    }
  }
}